

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O1

HighsInt highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                   (int *key,HighsInt root,anon_class_8_1_8991fb9c *get_left,
                   anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  HPresolve *pHVar4;
  HPresolve *pHVar5;
  pointer piVar6;
  pointer piVar7;
  char cVar8;
  int *piVar9;
  int *piVar10;
  HighsInt y;
  long lVar11;
  bool bVar12;
  int local_28;
  int local_24;
  HighsInt Nright;
  HighsInt Nleft;
  
  if (root == -1) {
    return -1;
  }
  piVar9 = &local_24;
  local_24 = -1;
  piVar10 = &local_28;
  local_28 = -1;
  piVar3 = (get_key->this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = get_right->this;
  pHVar5 = get_left->this;
  do {
    iVar1 = *key;
    if (iVar1 < piVar3[root]) {
      piVar6 = (pHVar5->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar6[root];
      lVar11 = (long)iVar2;
      if (lVar11 == -1) goto LAB_00321d9a;
      if (iVar1 < piVar3[lVar11]) {
        piVar7 = (pHVar4->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6[root] = piVar7[lVar11];
        piVar7[lVar11] = root;
        bVar12 = piVar6[lVar11] == -1;
        root = iVar2;
        if (bVar12) goto LAB_00321da1;
      }
      *piVar9 = root;
      piVar9 = piVar6 + root;
      root = *piVar9;
LAB_00321d51:
      cVar8 = '\0';
    }
    else {
      if (iVar1 <= piVar3[root]) break;
      piVar6 = (pHVar4->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar6[root];
      lVar11 = (long)iVar2;
      if (lVar11 != -1) {
        if (piVar3[lVar11] < iVar1) {
          piVar7 = (pHVar5->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6[root] = piVar7[lVar11];
          piVar7[lVar11] = root;
          bVar12 = piVar6[lVar11] == -1;
          root = iVar2;
          if (bVar12) {
LAB_00321da1:
            cVar8 = bVar12 * '\x03';
            goto LAB_00321da9;
          }
        }
        *piVar10 = root;
        piVar10 = piVar6 + root;
        root = *piVar10;
        goto LAB_00321d51;
      }
LAB_00321d9a:
      cVar8 = '\x03';
    }
LAB_00321da9:
  } while (cVar8 == '\0');
  piVar3 = (get_left->this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar10 = piVar3[root];
  piVar6 = (get_right->this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar9 = piVar6[root];
  piVar3[root] = local_28;
  piVar6[root] = local_24;
  return root;
}

Assistant:

HighsInt highs_splay(const KeyT& key, HighsInt root, GetLeft&& get_left,
                     GetRight&& get_right, GetKey&& get_key) {
  if (root == -1) return -1;

  HighsInt Nleft = -1;
  HighsInt Nright = -1;
  HighsInt* lright = &Nright;
  HighsInt* rleft = &Nleft;

  while (true) {
    if (key < get_key(root)) {
      HighsInt left = get_left(root);
      if (left == -1) break;
      if (key < get_key(left)) {
        HighsInt y = left;
        get_left(root) = get_right(y);
        get_right(y) = root;
        root = y;
        if (get_left(root) == -1) break;
      }

      *rleft = root;
      rleft = &get_left(root);
      root = get_left(root);
    } else if (key > get_key(root)) {
      HighsInt right = get_right(root);
      if (right == -1) break;
      if (key > get_key(right)) {
        HighsInt y = right;
        get_right(root) = get_left(y);
        get_left(y) = root;
        root = y;
        if (get_right(root) == -1) break;
      }

      *lright = root;
      lright = &get_right(root);
      root = get_right(root);
    } else
      break;
  }

  *lright = get_left(root);
  *rleft = get_right(root);
  get_left(root) = Nright;
  get_right(root) = Nleft;

  return root;
}